

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O3

void bn_almost_mont_mul_u32
               (uint32_t len,uint32_t *n,uint32_t nInv_u64,uint32_t *aM,uint32_t *bM,uint32_t *resM)

{
  long lVar1;
  uint32_t *res;
  uint32_t *n_00;
  uint32_t nInv;
  uint32_t *res_00;
  uint32_t *tmp;
  uint32_t auStack_50 [2];
  uint32_t *local_48;
  uint32_t *local_40;
  uint32_t local_34;
  
  lVar1 = -((ulong)(len * 2) * 4 + 0xf & 0xfffffffffffffff0);
  res_00 = (uint32_t *)((long)&local_48 + lVar1);
  local_48 = resM;
  local_40 = n;
  local_34 = nInv_u64;
  *(undefined8 *)((long)auStack_50 + lVar1) = 0x134249;
  memset(res_00,0,(ulong)(len * 2) << 2);
  tmp = res_00 + -(ulong)(len * 4);
  tmp[-2] = 0x134268;
  tmp[-1] = 0;
  memset(tmp,0,(ulong)(len * 4) * 4);
  tmp[-2] = 0x13427c;
  tmp[-1] = 0;
  Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint32(len,aM,bM,tmp,res_00);
  nInv = local_34;
  n_00 = local_40;
  res = local_48;
  tmp[-2] = 0x134292;
  tmp[-1] = 0;
  Hacl_Bignum_AlmostMontgomery_bn_almost_mont_reduction_u32(len,n_00,nInv,res_00,res);
  return;
}

Assistant:

static void
bn_almost_mont_mul_u32(
  uint32_t len,
  uint32_t *n,
  uint32_t nInv_u64,
  uint32_t *aM,
  uint32_t *bM,
  uint32_t *resM
)
{
  KRML_CHECK_SIZE(sizeof (uint32_t), len + len);
  uint32_t c[len + len];
  memset(c, 0U, (len + len) * sizeof (uint32_t));
  KRML_CHECK_SIZE(sizeof (uint32_t), 4U * len);
  uint32_t tmp[4U * len];
  memset(tmp, 0U, 4U * len * sizeof (uint32_t));
  Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint32(len, aM, bM, tmp, c);
  Hacl_Bignum_AlmostMontgomery_bn_almost_mont_reduction_u32(len, n, nInv_u64, c, resM);
}